

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void sx_fiber_stack_release(sx_fiber_stack *fstack)

{
  code *pcVar1;
  
  if (fstack->sptr == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x54,"fstack->sptr");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  munmap((void *)((long)fstack->sptr - (ulong)fstack->ssize),(ulong)fstack->ssize);
  return;
}

Assistant:

void sx_fiber_stack_release(sx_fiber_stack* fstack)
{
    sx_assert(fstack->sptr);
    void* ptr = (uint8_t*)fstack->sptr - fstack->ssize;

#if SX_PLATFORM_WINDOWS
    VirtualFree(ptr, 0, MEM_RELEASE);
#elif SX_PLATFORM_POSIX
    munmap(ptr, fstack->ssize);
#else
    free(ptr);
#endif
}